

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi_info_from_callbacks(stbi_io_callbacks *c,void *user,int *x,int *y,int *comp)

{
  int *piVar1;
  int iVar2;
  undefined1 local_f8 [8];
  stbi__context s;
  
  s.io.skip = (_func_void_void_ptr_int *)c->eof;
  piVar1 = &s.read_from_callbacks;
  s.img_n = *(int *)&c->read;
  s.img_out_n = *(int *)((long)&c->read + 4);
  s.io.read._0_4_ = *(undefined4 *)&c->skip;
  s.io.read._4_4_ = *(undefined4 *)((long)&c->skip + 4);
  s.io_user_data = (void *)0x8000000001;
  s.io.eof = (_func_int_void_ptr *)user;
  s.img_buffer_end = (stbi_uc *)piVar1;
  iVar2 = (*c->read)(user,(char *)piVar1,0x80);
  if (iVar2 == 0) {
    s.img_buffer = (stbi_uc *)((long)&s.read_from_callbacks + 1);
    s.io_user_data = (void *)((ulong)s.io_user_data & 0xffffffff00000000);
    s.read_from_callbacks._0_1_ = 0;
  }
  else {
    s.img_buffer = (stbi_uc *)((long)iVar2 + (long)piVar1);
  }
  s.buffer_start._120_8_ = piVar1;
  iVar2 = stbi__info_main((stbi__context *)local_f8,x,y,comp);
  return iVar2;
}

Assistant:

STBIDEF int stbi_info_from_callbacks(stbi_io_callbacks const *c, void *user, int *x, int *y, int *comp)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) c, user);
   return stbi__info_main(&s,x,y,comp);
}